

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError TestParameters(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *parameters,
                      double sampleRate,StreamDirection streamDir)

{
  undefined8 uVar1;
  long lVar2;
  double sampleRate_00;
  snd_pcm_t *psVar3;
  int iVar4;
  int iVar5;
  snd_pcm_format_t sVar6;
  PaError PVar7;
  size_t __n;
  PaSampleFormat availableFormats;
  PaSampleFormat PVar8;
  pthread_t pVar9;
  char *pcVar10;
  snd_pcm_hw_params_t *hwParams;
  int __pa_unsure_error_id;
  undefined8 uStack_50;
  snd_pcm_hw_params_t asStack_48 [8];
  double local_40;
  snd_pcm_t *local_38;
  snd_pcm_t *pcm;
  
  local_38 = (snd_pcm_t *)0x0;
  uStack_50 = 0x10ec3b;
  local_40 = sampleRate;
  __n = snd_pcm_hw_params_sizeof();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  hwParams = asStack_48 + lVar2;
  *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ec59;
  memset(hwParams,0,__n);
  if (parameters->hostApiSpecificStreamInfo == (void *)0x0) {
    iVar5 = *(int *)((long)&hostApi->deviceInfos[parameters->device][1].name +
                    (ulong)(streamDir != StreamDirection_In) * 4 + 4);
    if (iVar5 < parameters->channelCount) {
      iVar5 = parameters->channelCount;
    }
  }
  else {
    iVar5 = parameters->channelCount;
  }
  *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ec9c;
  paUtilErr_ = AlsaOpen(hostApi,parameters,streamDir,&local_38);
  psVar3 = local_38;
  if (paUtilErr_ < 0) {
    pcVar10 = 
    "Expression \'AlsaOpen( hostApi, parameters, streamDir, &pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1833\n"
    ;
  }
  else {
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ecb6;
    snd_pcm_hw_params_any(psVar3,hwParams);
    psVar3 = local_38;
    sampleRate_00 = local_40;
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ecc7;
    iVar4 = SetApproximateSampleRate(psVar3,hwParams,sampleRate_00);
    psVar3 = local_38;
    if (iVar4 < 0) {
      PVar7 = -0x270d;
      goto LAB_0010edac;
    }
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ecde;
    iVar5 = snd_pcm_hw_params_set_channels(psVar3,hwParams,iVar5);
    psVar3 = local_38;
    if (iVar5 < 0) {
      PVar7 = -0x270e;
      goto LAB_0010edac;
    }
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ecef;
    availableFormats = GetAvailableFormats(psVar3);
    PVar8 = parameters->sampleFormat;
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ecfb;
    PVar8 = PaUtil_SelectClosestAvailableFormat(availableFormats,PVar8);
    psVar3 = local_38;
    paUtilErr_ = (PaError)PVar8;
    if (-1 < paUtilErr_) {
      *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ed15;
      sVar6 = Pa2AlsaFormat(PVar8);
      *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ed22;
      iVar5 = snd_pcm_hw_params_set_format(psVar3,hwParams,sVar6);
      psVar3 = local_38;
      if (iVar5 < 0) {
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10edf2;
        pVar9 = pthread_self();
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ee04;
        iVar4 = pthread_equal(pVar9,paUnixMainThread);
        if (iVar4 != 0) {
          *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ee13;
          pcVar10 = (char *)snd_strerror(iVar5);
          *(undefined8 *)(asStack_48 + lVar2 + -8) = 8;
          uVar1 = *(undefined8 *)(asStack_48 + lVar2 + -8);
          *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ee21;
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar5,pcVar10);
        }
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ee2f;
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1854\n"
                         );
        PVar7 = -9999;
      }
      else {
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ed36;
        iVar5 = snd_pcm_hw_params(psVar3,hwParams);
        PVar7 = 0;
        if ((iVar5 < 0) && (PVar7 = -0x2709, iVar5 != -0x16)) {
          PVar7 = -0x2701;
          if (iVar5 != -0x10) {
            *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ed61;
            pVar9 = pthread_self();
            *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ed73;
            iVar4 = pthread_equal(pVar9,paUnixMainThread);
            PVar7 = -9999;
            if (iVar4 != 0) {
              *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ed82;
              pcVar10 = (char *)snd_strerror(iVar5);
              *(undefined8 *)(asStack_48 + lVar2 + -8) = 8;
              uVar1 = *(undefined8 *)(asStack_48 + lVar2 + -8);
              *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ed90;
              PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar5,pcVar10);
            }
          }
          *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ed9e;
          PaUtil_DebugPrint(
                           "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1877\n"
                           );
        }
      }
      goto LAB_0010edac;
    }
    pcVar10 = 
    "Expression \'hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1851\n"
    ;
  }
  *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10ede2;
  PaUtil_DebugPrint(pcVar10);
  PVar7 = paUtilErr_;
LAB_0010edac:
  if (local_38 != (snd_pcm_t *)0x0) {
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10edba;
    snd_pcm_close();
  }
  return PVar7;
}

Assistant:

static PaError TestParameters( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *parameters,
        double sampleRate, StreamDirection streamDir )
{
    PaError result = paNoError;
    snd_pcm_t *pcm = NULL;
    PaSampleFormat availableFormats;
    /* We are able to adapt to a number of channels less than what the device supports */
    unsigned int numHostChannels;
    PaSampleFormat hostFormat;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    if( !parameters->hostApiSpecificStreamInfo )
    {
        const PaAlsaDeviceInfo *devInfo = GetDeviceInfo( hostApi, parameters->device );
        numHostChannels = PA_MAX( parameters->channelCount, StreamDirection_In == streamDir ?
                devInfo->minInputChannels : devInfo->minOutputChannels );
    }
    else
        numHostChannels = parameters->channelCount;

    PA_ENSURE( AlsaOpen( hostApi, parameters, streamDir, &pcm ) );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( SetApproximateSampleRate( pcm, hwParams, sampleRate ) < 0 )
    {
        result = paInvalidSampleRate;
        goto error;
    }

    if( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, numHostChannels ) < 0 )
    {
        result = paInvalidChannelCount;
        goto error;
    }

    /* See if we can find a best possible match */
    availableFormats = GetAvailableFormats( pcm );
    PA_ENSURE( hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat ) );

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) ), paUnanticipatedHostError );

    {
        /* It happens that this call fails because the device is busy */
        int ret = 0;
        if( ( ret = alsa_snd_pcm_hw_params( pcm, hwParams ) ) < 0 )
        {
            if( -EINVAL == ret )
            {
                /* Don't know what to return here */
                result = paBadIODeviceCombination;
                goto error;
            }
            else if( -EBUSY == ret )
            {
                result = paDeviceUnavailable;
                PA_DEBUG(( "%s: Device is busy\n", __FUNCTION__ ));
            }
            else
            {
                result = paUnanticipatedHostError;
            }

            ENSURE_( ret, result );
        }
    }

end:
    if( pcm )
    {
        alsa_snd_pcm_close( pcm );
    }
    return result;

error:
    goto end;
}